

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependencyInfoParser.cpp
# Opt level: O2

void __thiscall llbuild::core::DependencyInfoParser::parse(DependencyInfoParser *this)

{
  char *pcVar1;
  uint __line;
  char cVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar3;
  _func_int **pp_Var4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  ParseActions *pPVar8;
  char *pcVar9;
  char *pcVar10;
  
  sVar6 = (this->data).Length;
  if ((sVar6 == 0) || ((this->data).Data[sVar6 - 1] != '\0')) {
    pPVar8 = this->actions;
    UNRECOVERED_JUMPTABLE = pPVar8->_vptr_ParseActions[2];
    pcVar7 = "missing null terminator";
  }
  else {
    cVar2 = llvm::StringRef::operator[](&this->data,0);
    if (cVar2 == '\0') {
      pcVar7 = (this->data).Data;
      pcVar9 = pcVar7 + (this->data).Length;
LAB_0014de7c:
      do {
        if (pcVar7 == pcVar9) {
          return;
        }
        pcVar1 = pcVar7 + 1;
        cVar2 = *pcVar7;
        lVar3 = 0;
        pcVar10 = pcVar1;
        while (*pcVar10 != '\0') {
          pcVar10 = pcVar10 + 1;
          lVar3 = lVar3 + -1;
          if (pcVar9 <= pcVar10) {
            pcVar7 = "cur < end";
            __line = 0x4f;
            goto LAB_0014df84;
          }
        }
        if (pcVar9 <= pcVar10) {
          pcVar7 = "*operandEnd == \'\\x00\' && cur < end";
          __line = 0x52;
LAB_0014df84:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/DependencyInfoParser.cpp"
                        ,__line,"void llbuild::core::DependencyInfoParser::parse()");
        }
        if (lVar3 == 0) {
          pPVar8 = this->actions;
          sVar6 = (long)pcVar7 - (long)(this->data).Data;
          UNRECOVERED_JUMPTABLE = pPVar8->_vptr_ParseActions[2];
          pcVar7 = "empty operand";
          goto LAB_0014de35;
        }
        pcVar10 = pcVar10 + 1;
        lVar3 = -lVar3;
        if (cVar2 != '@') {
          if (cVar2 == '\x10') {
            (*this->actions->_vptr_ParseActions[4])(this->actions,pcVar1,lVar3);
            pcVar7 = pcVar10;
          }
          else {
            if (cVar2 != '\x11') {
              if (cVar2 == '\0') {
                pPVar8 = this->actions;
                lVar5 = (long)pcVar7 - (long)(this->data).Data;
                if (lVar5 == 0) {
                  (*pPVar8->_vptr_ParseActions[3])(pPVar8,pcVar1,lVar3);
                  pcVar7 = pcVar10;
                  goto LAB_0014de7c;
                }
                pp_Var4 = pPVar8->_vptr_ParseActions;
                pcVar7 = "invalid duplicate version";
              }
              else {
                pPVar8 = this->actions;
                lVar5 = (long)pcVar7 - (long)(this->data).Data;
                pp_Var4 = pPVar8->_vptr_ParseActions;
                pcVar7 = "unknown opcode in file";
              }
              (*pp_Var4[2])(pPVar8,pcVar7,lVar5);
              pcVar7 = pcVar10;
              goto LAB_0014de7c;
            }
            (*this->actions->_vptr_ParseActions[6])(this->actions,pcVar1,lVar3);
            pcVar7 = pcVar10;
          }
          goto LAB_0014de7c;
        }
        (*this->actions->_vptr_ParseActions[5])(this->actions,pcVar1,lVar3);
        pcVar7 = pcVar10;
      } while( true );
    }
    pPVar8 = this->actions;
    UNRECOVERED_JUMPTABLE = pPVar8->_vptr_ParseActions[2];
    pcVar7 = "missing version record";
    sVar6 = 0;
  }
LAB_0014de35:
  (*UNRECOVERED_JUMPTABLE)(pPVar8,pcVar7,sVar6);
  return;
}

Assistant:

void DependencyInfoParser::parse() {
  // Validate that the file ends with a null byte, if not it is malformed and we
  // just bail on parsing.
  if (!data.endswith(StringRef("\0", 1))) {
    actions.error("missing null terminator", data.size());
    return;
  }

  // Validate that the file starts with the version record.
  if (Opcode(data[0]) != Opcode::Version) {
    actions.error("missing version record", 0);
    return;
  }

  // Parse the records in turn.
  const char* cur = data.begin();
  const char* end = data.end();
  while (cur != end) {
    const char* opcodeStart = cur;
    auto opcode = Opcode(*cur++);
    const char* operandStart = cur;
    while (*cur != '\0') {
      ++cur;
      // We require the file have a terminating null, so we can never scan past
      // the end.
      assert (cur < end);
    }
    const char* operandEnd = cur;
    assert(*operandEnd == '\x00' && cur < end);
    ++cur;

    // Diagnose empty operands (missing isn't possible.
    auto operand = StringRef(operandStart, operandEnd - operandStart);
    if (operand.empty()) {
      actions.error("empty operand", opcodeStart - data.data());
      break;
    }

    // Handle the opcode.
    switch (opcode) {
    case Opcode::Version: {
      // Diagnose duplicate version records.
      if (opcodeStart != data.begin()) {
        actions.error("invalid duplicate version", opcodeStart - data.data());
        break;
      }
      actions.actOnVersion(operand);
      break;
    }

    case Opcode::Input: {
      actions.actOnInput(operand);
      break;
    }

    case Opcode::Missing: {
      actions.actOnMissing(operand);
      break;
    }

    case Opcode::Output: {
      actions.actOnOutput(operand);
      break;
    }

    default:
      actions.error("unknown opcode in file", opcodeStart - data.data());
      break;
    }
  }
}